

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O2

void predict_or_learn<true>(boosting *o,single_learner *base,example *ec)

{
  float fVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  int iVar7;
  int i;
  size_t i_00;
  uint uVar8;
  long k;
  float fVar9;
  float local_5c;
  float local_58;
  
  fVar1 = ec->weight;
  o->t = o->t + 1;
  iVar7 = -1;
  local_58 = 0.0;
  local_5c = 0.0;
  for (i_00 = 0; iVar2 = o->N, (long)i_00 < (long)iVar2; i_00 = i_00 + 1) {
    uVar8 = iVar2 + iVar7;
    fVar9 = floorf(((float)(iVar2 + iVar7 + 1) - local_58) * 0.5);
    if (((int)uVar8 < 0) || ((float)(int)uVar8 < fVar9)) {
      lVar6 = 0;
    }
    else {
      lVar6 = 0;
      if (0.0 <= fVar9) {
        k = (long)fVar9;
        lVar3 = *(long *)&(o->C).
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar8].
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data;
        lVar6 = *(long *)(lVar3 + k * 8);
        if (lVar6 == -1) {
          lVar6 = choose((ulong)uVar8,k);
          *(long *)(lVar3 + k * 8) = lVar6;
        }
      }
    }
    dVar4 = pow((double)o->gamma + 0.5,(double)fVar9);
    dVar5 = pow(0.5 - (double)o->gamma,(double)((float)(o->N + iVar7) - fVar9));
    ec->weight = (float)dVar5 * (float)dVar4 * (float)lVar6 * fVar1;
    LEARNER::learner<char,_example>::predict(base,ec,i_00);
    local_58 = local_58 + (ec->l).simple.label * (ec->pred).scalar;
    local_5c = local_5c + (ec->pred).scalar;
    LEARNER::learner<char,_example>::learn(base,ec,i_00);
    iVar7 = iVar7 + -1;
  }
  ec->weight = fVar1;
  ec->partial_prediction = local_5c;
  fVar9 = *(float *)(&DAT_00233530 + (ulong)(0.0 < local_5c) * 4);
  (ec->pred).scalar = fVar9;
  ec->loss = (float)(~-(uint)(fVar9 == (ec->l).simple.label) & (uint)fVar1);
  return;
}

Assistant:

void predict_or_learn(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0;

  float s = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float k = floorf((float)(o.N - i - s) / 2);
      int64_t c;
      if (o.N - (i + 1) < 0)
        c = 0;
      else if (k > o.N - (i + 1))
        c = 0;
      else if (k < 0)
        c = 0;
      else if (o.C[o.N - (i + 1)][(int64_t)k] != -1)
        c = o.C[o.N - (i + 1)][(int64_t)k];
      else
      {
        c = choose(o.N - (i + 1), (int64_t)k);
        o.C[o.N - (i + 1)][(int64_t)k] = c;
      }

      float w = c * (float)pow((double)(0.5 + o.gamma), (double)k) *
          (float)pow((double)0.5 - o.gamma, (double)(o.N - (i + 1) - k));

      // update ec.weight, weight for learner i (starting from 0)
      ec.weight = u * w;

      base.predict(ec, i);

      // ec.pred.scalar is now the i-th learner prediction on this example
      s += ld.label * ec.pred.scalar;

      final_prediction += ec.pred.scalar;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      final_prediction += ec.pred.scalar;
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}